

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

void __thiscall PDA::Transducer::Tokenizer::printTokens(Tokenizer *this)

{
  pointer pTVar1;
  int iVar2;
  wostream *pwVar3;
  Token *token;
  pointer pTVar4;
  
  pwVar3 = std::operator<<((wostream *)&std::wcout,"================LEX TABLE=====================")
  ;
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  pTVar1 = (this->m_tokens).
           super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  iVar2 = 1;
  for (pTVar4 = (this->m_tokens).
                super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar4 != pTVar1; pTVar4 = pTVar4 + 1) {
    if (pTVar4->line != iVar2) {
      std::endl<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout);
    }
    std::operator<<((wostream *)&std::wcout,pTVar4->token);
    iVar2 = pTVar4->line;
  }
  std::endl<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout);
  pwVar3 = std::operator<<((wostream *)&std::wcout,"=============================================");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  return;
}

Assistant:

void Tokenizer::printTokens() const
{
    std::wcout << "================LEX TABLE=====================" << std::endl;
    int lastLine(1);
    for(const Token &token : m_tokens)
    {
        if (token.line != lastLine)
            std::wcout << std::endl;
        std::wcout << token.token;
        lastLine = token.line;
    }
    std::wcout << std::endl;
    std::wcout << "=============================================" << std::endl;
}